

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_setupvali(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  GCObject *pGVar1;
  GCObject *pGVar2;
  int iVar3;
  TValue *io;
  UpVal *uv;
  lua_Integer ia;
  TValue *pTStack_20;
  int b_local;
  TValue *ra_local;
  LClosure *cl_local;
  lua_State *L_local;
  
  ia._4_4_ = b;
  pTStack_20 = ra;
  ra_local = (TValue *)cl;
  cl_local = (LClosure *)L;
  if (ra->tt_ == 0x13) {
    if (ra->tt_ != 0x13) {
      __assert_fail("((((ra))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xba5,"void raviV_op_setupvali(lua_State *, LClosure *, TValue *, int)");
    }
    uv = (UpVal *)(ra->value_).gc;
  }
  else {
    iVar3 = luaV_tointegerns(ra,(lua_Integer *)&uv,F2Ieq);
    if (iVar3 == 0) {
      luaG_runerror((lua_State *)cl_local,
                    "upvalue of integer type, cannot be set to non integer value");
    }
  }
  pGVar1 = (&ra_local[2].value_)[ia._4_4_].gc;
  pGVar2 = pGVar1->next;
  pGVar2->next = (GCObject *)uv;
  pGVar2->tt = '\x13';
  pGVar2->marked = '\0';
  if (((pTStack_20->tt_ & 0x8000) != 0) && (pGVar1->next == pGVar1 + 1)) {
    if ((pTStack_20->tt_ & 0x8000) == 0) {
      __assert_fail("(((ra)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xba8,"void raviV_op_setupvali(lua_State *, LClosure *, TValue *, int)");
    }
    luaC_upvalbarrier_((lua_State *)cl_local,(pTStack_20->value_).gc);
  }
  return;
}

Assistant:

void raviV_op_setupvali(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Integer ia;
  if (tointegerns(ra, &ia)) {
    UpVal *uv = cl->upvals[b];
    setivalue(uv->v, ia);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(
        L, "upvalue of integer type, cannot be set to non integer value");
}